

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::Shutdown(void)

{
  internal::ExplicitlyConstructed<google::protobuf::compiler::Version>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::compiler::Version> *)
             _Version_default_instance_);
  if (DAT_007001d8 != (long *)0x0) {
    (**(code **)(*DAT_007001d8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorRequest>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorRequest> *)
             _CodeGeneratorRequest_default_instance_);
  if (DAT_007001e8 != (long *)0x0) {
    (**(code **)(*DAT_007001e8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse_File>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse_File> *)
             _CodeGeneratorResponse_File_default_instance_);
  if (DAT_007001f8 != (long *)0x0) {
    (**(code **)(*DAT_007001f8 + 8))();
  }
  internal::ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse>::Shutdown
            ((ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse> *)
             _CodeGeneratorResponse_default_instance_);
  if (DAT_00700208 != (long *)0x0) {
    (**(code **)(*DAT_00700208 + 8))();
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Version_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _CodeGeneratorRequest_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _CodeGeneratorResponse_File_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _CodeGeneratorResponse_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
}